

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,StructNew *curr)

{
  Type this_00;
  ulong uVar1;
  Flow *pFVar2;
  long *plVar3;
  long lVar4;
  Literal *pLVar5;
  undefined8 uVar6;
  Flow *pFVar7;
  ulong uVar8;
  Literal *this_01;
  uint uVar9;
  int iVar10;
  undefined8 *puVar11;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> local_108;
  HeapType heapType;
  undefined1 local_d0 [8];
  Literals data;
  GCData *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *local_60;
  Literal *local_58;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_50;
  Flow *local_48;
  size_t local_40;
  undefined1 local_31;
  
  local_60 = this;
  local_48 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id == 1) {
    local_40 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    if (local_40 != 0) {
      uVar8 = 0;
      do {
        pFVar7 = local_48;
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar8) goto LAB_0012ef7d;
        pFVar2 = visit(local_48,local_60,
                       (curr->operands).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       data[uVar8]);
        if ((pFVar7->breakTo).super_IString.str._M_str != (char *)0x0) {
          return pFVar2;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        wasm::Literal::~Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems);
        uVar8 = uVar8 + 1;
      } while (local_40 != uVar8);
    }
    wasm::handle_unreachable
              ("unreachable but no unreachable child",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0x602);
  }
  local_108._24_8_ = wasm::Type::getHeapType();
  plVar3 = (long *)wasm::HeapType::getStruct();
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_d0,plVar3[1] - *plVar3 >> 4);
  lVar4 = *plVar3;
  if (plVar3[1] != lVar4) {
    local_50 = &(local_48->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
    local_58 = (local_48->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
    iVar10 = 1;
    uVar8 = 0;
    do {
      pFVar7 = local_48;
      local_40 = CONCAT44(local_40._4_4_,iVar10);
      puVar11 = (undefined8 *)(uVar8 * 0x10 + lVar4);
      uVar1 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (uVar1 == 0) {
        this_00.id = (uintptr_t)
                     &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        wasm::Literal::makeZero(this_00);
        pLVar5 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 uVar8 * 0x18);
        if ((uint)local_40 == 1) {
          pLVar5 = (Literal *)&data;
        }
        wasm::Literal::operator=(pLVar5,(Literal *)this_00.id);
        wasm::Literal::~Literal((Literal *)this_00.id);
        uVar9 = (uint)local_40;
      }
      else {
        if (uVar1 <= uVar8) {
LAB_0012ef7d:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        visit(local_48,local_60,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar8]
             );
        if ((pFVar7->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_0012ef53;
        pLVar5 = Flow::getSingleValue(pFVar7);
        wasm::Literal::Literal((Literal *)&local_108,pLVar5);
        pLVar5 = (Literal *)
                 &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        truncateForPacking(pLVar5,&local_108,(Literal *)*puVar11,
                           (Field *)(ulong)*(uint *)(puVar11 + 1));
        uVar9 = (uint)local_40;
        this_01 = (Literal *)
                  ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                  uVar8 * 0x18);
        if ((uint)local_40 == 1) {
          this_01 = (Literal *)&data;
        }
        wasm::Literal::operator=(this_01,pLVar5);
        wasm::Literal::~Literal(pLVar5);
        wasm::Literal::~Literal((Literal *)&local_108);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_50);
        wasm::Literal::~Literal(local_58);
      }
      uVar8 = (ulong)uVar9;
      lVar4 = *plVar3;
      iVar10 = uVar9 + 1;
    } while (uVar8 < (ulong)(plVar3[1] - lVar4 >> 4));
  }
  data.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)wasm::Type::getHeapType();
  local_70 = (GCData *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
            (&local_68,&local_70,(allocator<wasm::GCData> *)&local_31,
             (HeapType *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Literals *)local_d0);
  uVar6 = wasm::Type::getHeapType();
  pFVar7 = local_48;
  wasm::Literal::Literal((Literal *)&heapType,&local_70,uVar6);
  Flow::Flow(pFVar7,(Literal *)&heapType);
  wasm::Literal::~Literal((Literal *)&heapType);
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
LAB_0012ef53:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  pFVar7 = (Flow *)wasm::Literal::~Literal((Literal *)&data);
  return pFVar7;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }